

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_add_sparse_entry(archive_read *a,tar *tar,int64_t offset,int64_t remaining)

{
  sparse_block *psVar1;
  sparse_block *p;
  int64_t remaining_local;
  int64_t offset_local;
  tar *tar_local;
  archive_read *a_local;
  
  psVar1 = (sparse_block *)calloc(1,0x20);
  if (psVar1 == (sparse_block *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    if (tar->sparse_last == (sparse_block *)0x0) {
      tar->sparse_list = psVar1;
    }
    else {
      tar->sparse_last->next = psVar1;
    }
    tar->sparse_last = psVar1;
    if ((remaining < 0) || (offset < 0)) {
      archive_set_error(&a->archive,-1,"Malformed sparse map data");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      psVar1->offset = offset;
      psVar1->remaining = remaining;
      a_local._4_4_ = L'\0';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
gnu_add_sparse_entry(struct archive_read *a, struct tar *tar,
    int64_t offset, int64_t remaining)
{
	struct sparse_block *p;

	p = (struct sparse_block *)calloc(1, sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	if (tar->sparse_last != NULL)
		tar->sparse_last->next = p;
	else
		tar->sparse_list = p;
	tar->sparse_last = p;
	if (remaining < 0 || offset < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC, "Malformed sparse map data");
		return (ARCHIVE_FATAL);
	}
	p->offset = offset;
	p->remaining = remaining;
	return (ARCHIVE_OK);
}